

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O3

void __thiscall btDbvt::collideTT(btDbvt *this,btDbvtNode *root0,btDbvtNode *root1,ICollide *policy)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btDbvtNode *pbVar3;
  btDbvtNode *pbVar4;
  btDbvtNode *pbVar5;
  undefined8 uVar6;
  sStkNN *psVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  btAlignedObjectArray<btDbvt::sStkNN> stkStack;
  btAlignedObjectArray<btDbvt::sStkNN> local_60;
  ICollide *local_40;
  long local_38;
  
  if (root1 == (btDbvtNode *)0x0 || root0 == (btDbvtNode *)0x0) {
    return;
  }
  local_60.m_ownsMemory = true;
  local_60.m_data = (sStkNN *)0x0;
  local_60.m_size = 0;
  local_60.m_capacity = 0;
  psVar7 = (sStkNN *)btAlignedAllocInternal(0x800,0x10);
  if ((long)local_60.m_size < 1) {
    if (local_60.m_data == (sStkNN *)0x0) goto LAB_001e35ec;
  }
  else {
    lVar8 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(local_60.m_data)->a + lVar8);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)&psVar7->a + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      lVar8 = lVar8 + 0x10;
    } while ((long)local_60.m_size * 0x10 != lVar8);
  }
  if (local_60.m_ownsMemory == true) {
    btAlignedFreeInternal(local_60.m_data);
  }
LAB_001e35ec:
  local_60.m_ownsMemory = true;
  local_60.m_size = 0x80;
  local_60.m_capacity = 0x80;
  psVar7->a = root0;
  psVar7->b = root1;
  iVar9 = 1;
  iVar12 = 0x7c;
  local_60.m_data = psVar7;
  local_40 = policy;
  do {
    lVar11 = (long)iVar9;
    iVar9 = iVar9 + -1;
    lVar8 = lVar11 + -1;
    pbVar3 = local_60.m_data[lVar8].a;
    pbVar4 = local_60.m_data[lVar8].b;
    if (iVar12 < iVar9) {
      uVar13 = local_60.m_size * 2;
      local_38 = lVar11;
      if ((local_60.m_size < (int)uVar13) && (local_60.m_capacity < (int)uVar13)) {
        if (local_60.m_size == 0) {
          psVar7 = (sStkNN *)0x0;
LAB_001e36a9:
          if (local_60.m_ownsMemory == true) {
            btAlignedFreeInternal(local_60.m_data);
          }
        }
        else {
          psVar7 = (sStkNN *)btAlignedAllocInternal((long)local_60.m_size << 5,0x10);
          if (0 < (long)local_60.m_size) {
            lVar11 = 0;
            do {
              puVar1 = (undefined8 *)((long)&(local_60.m_data)->a + lVar11);
              uVar6 = puVar1[1];
              puVar2 = (undefined8 *)((long)&psVar7->a + lVar11);
              *puVar2 = *puVar1;
              puVar2[1] = uVar6;
              lVar11 = lVar11 + 0x10;
            } while ((long)local_60.m_size * 0x10 != lVar11);
            goto LAB_001e36a9;
          }
          if (local_60.m_data != (sStkNN *)0x0) goto LAB_001e36a9;
        }
        local_60.m_ownsMemory = true;
        local_60._4_8_ = (ulong)uVar13 << 0x20;
        local_60.m_data = psVar7;
      }
      local_60.m_size = uVar13;
      iVar12 = uVar13 - 4;
      lVar11 = local_38;
    }
    iVar10 = (int)lVar11;
    if (pbVar3 == pbVar4) {
      if ((pbVar3->field_2).childs[1] != (btDbvtNode *)0x0) {
        pbVar4 = (pbVar3->field_2).childs[0];
        local_60.m_data[lVar8].a = pbVar4;
        local_60.m_data[lVar8].b = pbVar4;
        pbVar4 = (pbVar3->field_2).childs[1];
        local_60.m_data[lVar11].a = pbVar4;
        local_60.m_data[lVar11].b = pbVar4;
        iVar9 = iVar10 + 2;
        pbVar4 = (pbVar3->field_2).childs[1];
        local_60.m_data[lVar11 + 1].a = (pbVar3->field_2).childs[0];
        local_60.m_data[lVar11 + 1].b = pbVar4;
      }
    }
    else if (((((pbVar3->volume).mi.m_floats[0] <= (pbVar4->volume).mx.m_floats[0]) &&
              ((pbVar4->volume).mi.m_floats[0] <= (pbVar3->volume).mx.m_floats[0])) &&
             ((pbVar3->volume).mi.m_floats[1] <= (pbVar4->volume).mx.m_floats[1])) &&
            ((((pbVar4->volume).mi.m_floats[1] <= (pbVar3->volume).mx.m_floats[1] &&
              ((pbVar3->volume).mi.m_floats[2] <= (pbVar4->volume).mx.m_floats[2])) &&
             ((pbVar4->volume).mi.m_floats[2] <= (pbVar3->volume).mx.m_floats[2])))) {
      if ((pbVar3->field_2).childs[1] == (btDbvtNode *)0x0) {
        if ((pbVar4->field_2).childs[1] == (btDbvtNode *)0x0) {
          (*local_40->_vptr_ICollide[2])(local_40,pbVar3,pbVar4);
        }
        else {
          pbVar5 = (pbVar4->field_2).childs[0];
          local_60.m_data[lVar8].a = pbVar3;
          local_60.m_data[lVar8].b = pbVar5;
          pbVar4 = (pbVar4->field_2).childs[1];
          iVar9 = iVar10 + 1;
          local_60.m_data[lVar11].a = pbVar3;
          local_60.m_data[lVar11].b = pbVar4;
        }
      }
      else if ((pbVar4->field_2).childs[1] == (btDbvtNode *)0x0) {
        local_60.m_data[lVar8].a = (pbVar3->field_2).childs[0];
        local_60.m_data[lVar8].b = pbVar4;
        iVar9 = iVar10 + 1;
        local_60.m_data[lVar11].a = (pbVar3->field_2).childs[1];
        local_60.m_data[lVar11].b = pbVar4;
      }
      else {
        pbVar5 = (pbVar4->field_2).childs[0];
        local_60.m_data[lVar8].a = (pbVar3->field_2).childs[0];
        local_60.m_data[lVar8].b = pbVar5;
        pbVar5 = (pbVar4->field_2).childs[0];
        local_60.m_data[lVar11].a = (pbVar3->field_2).childs[1];
        local_60.m_data[lVar11].b = pbVar5;
        pbVar5 = (pbVar4->field_2).childs[1];
        local_60.m_data[lVar11 + 1].a = (pbVar3->field_2).childs[0];
        local_60.m_data[lVar11 + 1].b = pbVar5;
        pbVar4 = (pbVar4->field_2).childs[1];
        iVar9 = iVar10 + 3;
        local_60.m_data[lVar11 + 2].a = (pbVar3->field_2).childs[1];
        local_60.m_data[lVar11 + 2].b = pbVar4;
      }
    }
    if (iVar9 == 0) {
      btAlignedObjectArray<btDbvt::sStkNN>::~btAlignedObjectArray(&local_60);
      return;
    }
  } while( true );
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::collideTT(	const btDbvtNode* root0,
								  const btDbvtNode* root1,
								  DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
		if(root0&&root1)
		{
			int								depth=1;
			int								treshold=DOUBLE_STACKSIZE-4;
			btAlignedObjectArray<sStkNN>	stkStack;
			stkStack.resize(DOUBLE_STACKSIZE);
			stkStack[0]=sStkNN(root0,root1);
			do	{		
				sStkNN	p=stkStack[--depth];
				if(depth>treshold)
				{
					stkStack.resize(stkStack.size()*2);
					treshold=stkStack.size()-4;
				}
				if(p.a==p.b)
				{
					if(p.a->isinternal())
					{
						stkStack[depth++]=sStkNN(p.a->childs[0],p.a->childs[0]);
						stkStack[depth++]=sStkNN(p.a->childs[1],p.a->childs[1]);
						stkStack[depth++]=sStkNN(p.a->childs[0],p.a->childs[1]);
					}
				}
				else if(Intersect(p.a->volume,p.b->volume))
				{
					if(p.a->isinternal())
					{
						if(p.b->isinternal())
						{
							stkStack[depth++]=sStkNN(p.a->childs[0],p.b->childs[0]);
							stkStack[depth++]=sStkNN(p.a->childs[1],p.b->childs[0]);
							stkStack[depth++]=sStkNN(p.a->childs[0],p.b->childs[1]);
							stkStack[depth++]=sStkNN(p.a->childs[1],p.b->childs[1]);
						}
						else
						{
							stkStack[depth++]=sStkNN(p.a->childs[0],p.b);
							stkStack[depth++]=sStkNN(p.a->childs[1],p.b);
						}
					}
					else
					{
						if(p.b->isinternal())
						{
							stkStack[depth++]=sStkNN(p.a,p.b->childs[0]);
							stkStack[depth++]=sStkNN(p.a,p.b->childs[1]);
						}
						else
						{
							policy.Process(p.a,p.b);
						}
					}
				}
			} while(depth);
		}
}